

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::benchmarkEnded
          (ConsoleReporter *this,
          BenchmarkStats<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *stats)

{
  ulong uVar1;
  TablePrinter *pTVar2;
  TablePrinter *pTVar3;
  TablePrinter *pTVar4;
  long in_RSI;
  long in_RDI;
  rep rVar5;
  Duration *in_stack_ffffffffffffff08;
  TablePrinter *in_stack_ffffffffffffff10;
  Duration local_b0;
  Duration local_98;
  Duration local_80;
  Duration local_68;
  Duration local_50;
  Duration local_38;
  Duration local_20;
  long local_10;
  
  local_10 = in_RSI;
  uVar1 = (**(code **)(**(long **)(in_RDI + 0x10) + 0xc0))();
  if ((uVar1 & 1) == 0) {
    pTVar2 = Detail::unique_ptr<Catch::TablePrinter>::operator*
                       ((unique_ptr<Catch::TablePrinter> *)(in_RDI + 0x90));
    pTVar2 = Catch::operator<<(pTVar2);
    rVar5 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x60));
    anon_unknown_26::Duration::Duration(&local_38,rVar5,Auto);
    pTVar3 = Catch::operator<<(in_stack_ffffffffffffff10,(Duration *)pTVar2);
    pTVar3 = Catch::operator<<(pTVar3);
    rVar5 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x68));
    anon_unknown_26::Duration::Duration(&local_50,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar3,(Duration *)pTVar2);
    Catch::operator<<(pTVar4);
    rVar5 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x70));
    anon_unknown_26::Duration::Duration(&local_68,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar3,(Duration *)pTVar2);
    pTVar4 = Catch::operator<<(pTVar4);
    Catch::operator<<(pTVar4);
    rVar5 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x80));
    anon_unknown_26::Duration::Duration(&local_80,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar3,(Duration *)pTVar2);
    Catch::operator<<(pTVar4);
    rVar5 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x88));
    anon_unknown_26::Duration::Duration(&local_98,rVar5,Auto);
    pTVar4 = Catch::operator<<(pTVar3,(Duration *)pTVar2);
    Catch::operator<<(pTVar4);
    rVar5 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x90));
    anon_unknown_26::Duration::Duration(&local_b0,rVar5,Auto);
    pTVar2 = Catch::operator<<(pTVar3,(Duration *)pTVar2);
    pTVar2 = Catch::operator<<(pTVar2);
    pTVar2 = Catch::operator<<(pTVar2);
    pTVar2 = Catch::operator<<(pTVar2);
    pTVar2 = Catch::operator<<(pTVar2);
    Catch::operator<<(pTVar2);
  }
  else {
    Detail::unique_ptr<Catch::TablePrinter>::operator*
              ((unique_ptr<Catch::TablePrinter> *)(in_RDI + 0x90));
    rVar5 = std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::count
                      ((duration<double,_std::ratio<1L,_1000000000L>_> *)(local_10 + 0x60));
    anon_unknown_26::Duration::Duration(&local_20,rVar5,Auto);
    pTVar2 = Catch::operator<<(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    Catch::operator<<(pTVar2);
  }
  return;
}

Assistant:

void ConsoleReporter::benchmarkEnded(BenchmarkStats<> const& stats) {
    if (m_config->benchmarkNoAnalysis())
    {
        (*m_tablePrinter) << Duration(stats.mean.point.count()) << ColumnBreak();
    }
    else
    {
        (*m_tablePrinter) << ColumnBreak()
            << Duration(stats.mean.point.count()) << ColumnBreak()
            << Duration(stats.mean.lower_bound.count()) << ColumnBreak()
            << Duration(stats.mean.upper_bound.count()) << ColumnBreak() << ColumnBreak()
            << Duration(stats.standardDeviation.point.count()) << ColumnBreak()
            << Duration(stats.standardDeviation.lower_bound.count()) << ColumnBreak()
            << Duration(stats.standardDeviation.upper_bound.count()) << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak() << ColumnBreak();
    }
}